

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O3

void multikey_cache<4u,true>(Cacheblock<4U>_conflict *cache,size_t N,size_t depth)

{
  byte *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  size_t i;
  ulong uVar15;
  Cacheblock<4U>_conflict *pCVar16;
  long lVar17;
  Cacheblock<4U>_conflict *pCVar18;
  ulong uVar19;
  Cacheblock<4U>_conflict *pCVar20;
  ulong uVar21;
  uint uVar22;
  Cacheblock<4U>_conflict *pCVar23;
  ulong uVar24;
  byte bVar25;
  byte bVar26;
  size_t sVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong N_00;
  ulong uVar31;
  
  lVar30 = depth + 1;
LAB_002247c7:
  if (0x1f < N) {
    uVar15 = 0;
    do {
      uVar22 = 0;
      lVar17 = 0x20;
      sVar27 = depth;
      do {
        if (lVar17 == 0) break;
        pbVar1 = cache[uVar15].ptr + sVar27;
        lVar17 = lVar17 + -8;
        uVar22 = uVar22 | (uint)*pbVar1 << ((byte)lVar17 & 0x1f);
        sVar27 = sVar27 + 1;
      } while (*pbVar1 != 0);
      cache[uVar15].cached_bytes = uVar22;
      uVar15 = uVar15 + 1;
    } while (uVar15 != N);
    uVar15 = N >> 3;
    uVar22 = cache->cached_bytes;
    uVar4 = cache[uVar15].cached_bytes;
    pCVar16 = cache;
    if (uVar22 != uVar4) {
      pCVar16 = cache + (N >> 2);
      uVar5 = pCVar16->cached_bytes;
      if ((uVar5 != uVar22) && (uVar5 != uVar4)) {
        if (uVar22 < uVar4) {
          if (uVar5 <= uVar22) {
            pCVar16 = cache;
          }
          if (uVar4 < uVar5) {
            pCVar16 = cache + uVar15;
          }
        }
        else {
          if (uVar22 < uVar5) {
            pCVar16 = cache;
          }
          if (uVar5 < uVar4) {
            pCVar16 = cache + uVar15;
          }
        }
      }
    }
    uVar28 = N >> 1;
    pCVar18 = cache + (uVar28 - uVar15);
    uVar22 = cache[uVar28 - uVar15].cached_bytes;
    uVar4 = cache[uVar28].cached_bytes;
    pCVar20 = pCVar18;
    if (uVar22 != uVar4) {
      pCVar23 = cache + uVar28;
      pCVar20 = pCVar23 + uVar15;
      uVar5 = pCVar20->cached_bytes;
      if ((uVar5 != uVar22) && (uVar5 != uVar4)) {
        if (uVar22 < uVar4) {
          if (uVar22 < uVar5) {
            pCVar18 = pCVar20;
          }
          pCVar20 = pCVar18;
          if (uVar4 < uVar5) {
            pCVar20 = pCVar23;
          }
        }
        else {
          if (uVar22 < uVar5) {
            pCVar20 = pCVar18;
          }
          if (uVar5 < uVar4) {
            pCVar20 = pCVar23;
          }
        }
      }
    }
    lVar29 = (N - (N >> 2)) + -1;
    pCVar18 = cache + lVar29;
    lVar17 = (N - uVar15) + -1;
    uVar22 = cache[lVar29].cached_bytes;
    uVar4 = cache[lVar17].cached_bytes;
    pCVar23 = pCVar18;
    if (uVar22 != uVar4) {
      pCVar23 = cache + (N - 3);
      uVar5 = pCVar23->cached_bytes;
      if ((uVar5 != uVar22) && (uVar5 != uVar4)) {
        if (uVar22 < uVar4) {
          if (uVar22 < uVar5) {
            pCVar18 = pCVar23;
          }
          pCVar23 = pCVar18;
          if (uVar4 < uVar5) {
            pCVar23 = cache + lVar17;
          }
        }
        else {
          if (uVar22 < uVar5) {
            pCVar23 = pCVar18;
          }
          if (uVar5 < uVar4) {
            pCVar23 = cache + lVar17;
          }
        }
      }
    }
    uVar22 = pCVar16->cached_bytes;
    uVar4 = pCVar20->cached_bytes;
    pCVar18 = pCVar16;
    if (((uVar22 != uVar4) && (uVar5 = pCVar23->cached_bytes, pCVar18 = pCVar23, uVar5 != uVar22))
       && (uVar5 != uVar4)) {
      if (uVar22 < uVar4) {
        if (uVar22 < uVar5) {
          pCVar16 = pCVar23;
        }
        pCVar18 = pCVar16;
        if (uVar4 < uVar5) {
          pCVar18 = pCVar20;
        }
      }
      else {
        if (uVar22 < uVar5) {
          pCVar23 = pCVar16;
        }
        pCVar18 = pCVar23;
        if (uVar5 < uVar4) {
          pCVar18 = pCVar20;
        }
      }
    }
    uVar31 = N - 1;
    uVar13 = cache->cached_bytes;
    uVar14 = *(undefined4 *)&cache->field_0x4;
    puVar6 = cache->ptr;
    uVar12 = *(undefined4 *)&pCVar18->field_0x4;
    puVar7 = pCVar18->ptr;
    cache->cached_bytes = pCVar18->cached_bytes;
    *(undefined4 *)&cache->field_0x4 = uVar12;
    cache->ptr = puVar7;
    pCVar18->cached_bytes = uVar13;
    *(undefined4 *)&pCVar18->field_0x4 = uVar14;
    pCVar18->ptr = puVar6;
    uVar22 = cache->cached_bytes;
    uVar15 = 1;
    uVar21 = 1;
    uVar24 = uVar31;
    uVar28 = uVar31;
    do {
      if (uVar21 <= uVar24) {
        pCVar16 = cache + uVar21;
        uVar19 = uVar15;
        do {
          uVar15 = uVar19;
          if (uVar22 < pCVar16->cached_bytes) break;
          if (uVar22 <= pCVar16->cached_bytes) {
            uVar15 = uVar19 + 1;
            pCVar18 = cache + uVar19;
            uVar13 = pCVar18->cached_bytes;
            uVar14 = *(undefined4 *)&pCVar18->field_0x4;
            puVar6 = pCVar18->ptr;
            uVar12 = *(undefined4 *)&pCVar16->field_0x4;
            puVar7 = pCVar16->ptr;
            pCVar18 = cache + uVar19;
            pCVar18->cached_bytes = pCVar16->cached_bytes;
            *(undefined4 *)&pCVar18->field_0x4 = uVar12;
            pCVar18->ptr = puVar7;
            pCVar16->cached_bytes = uVar13;
            *(undefined4 *)&pCVar16->field_0x4 = uVar14;
            pCVar16->ptr = puVar6;
          }
          uVar21 = uVar21 + 1;
          pCVar16 = pCVar16 + 1;
          uVar19 = uVar15;
        } while (uVar21 <= uVar24);
      }
      if (uVar21 <= uVar24) {
        pCVar16 = cache + uVar24;
        uVar19 = uVar28;
        do {
          uVar28 = uVar19;
          if (pCVar16->cached_bytes < uVar22) break;
          if (pCVar16->cached_bytes == uVar22) {
            uVar28 = uVar19 - 1;
            pCVar18 = cache + uVar19;
            uVar13 = pCVar18->cached_bytes;
            uVar14 = *(undefined4 *)&pCVar18->field_0x4;
            puVar6 = pCVar18->ptr;
            uVar12 = *(undefined4 *)&pCVar16->field_0x4;
            puVar7 = pCVar16->ptr;
            pCVar18 = cache + uVar19;
            pCVar18->cached_bytes = pCVar16->cached_bytes;
            *(undefined4 *)&pCVar18->field_0x4 = uVar12;
            pCVar18->ptr = puVar7;
            pCVar16->cached_bytes = uVar13;
            *(undefined4 *)&pCVar16->field_0x4 = uVar14;
            pCVar16->ptr = puVar6;
          }
          uVar24 = uVar24 - 1;
          pCVar16 = pCVar16 + -1;
          uVar19 = uVar28;
        } while (uVar21 <= uVar24);
      }
      if (uVar24 < uVar21) goto LAB_00224a80;
      pCVar16 = cache + uVar21;
      uVar13 = pCVar16->cached_bytes;
      uVar14 = *(undefined4 *)&pCVar16->field_0x4;
      puVar6 = pCVar16->ptr;
      pCVar16 = cache + uVar24;
      uVar12 = *(undefined4 *)&pCVar16->field_0x4;
      puVar7 = pCVar16->ptr;
      pCVar18 = cache + uVar21;
      pCVar18->cached_bytes = pCVar16->cached_bytes;
      *(undefined4 *)&pCVar18->field_0x4 = uVar12;
      pCVar18->ptr = puVar7;
      pCVar16 = cache + uVar24;
      pCVar16->cached_bytes = uVar13;
      *(undefined4 *)&pCVar16->field_0x4 = uVar14;
      pCVar16->ptr = puVar6;
      uVar21 = uVar21 + 1;
      uVar24 = uVar24 - 1;
    } while( true );
  }
  pCVar16 = cache;
  if (1 < N) {
    do {
      puVar6 = pCVar16[1].ptr;
      for (pCVar18 = pCVar16 + 1; cache < pCVar18; pCVar18 = pCVar18 + -1) {
        puVar7 = pCVar18[-1].ptr;
        bVar25 = puVar7[depth];
        bVar26 = puVar6[depth];
        if ((bVar25 != 0) && (lVar17 = lVar30, bVar25 == bVar26)) {
          do {
            bVar25 = puVar7[lVar17];
            bVar26 = puVar6[lVar17];
            if (bVar25 == 0) break;
            lVar17 = lVar17 + 1;
          } while (bVar25 == bVar26);
        }
        if (bVar25 <= bVar26) break;
        pCVar18->ptr = puVar7;
      }
      iVar8 = (int)N;
      pCVar18->ptr = puVar6;
      N = (size_t)(iVar8 - 1);
      pCVar16 = pCVar16 + 1;
    } while (2 < iVar8);
  }
  return;
LAB_00224a80:
  N_00 = uVar21 - uVar15;
  uVar19 = uVar15;
  if (N_00 < uVar15) {
    uVar19 = N_00;
  }
  if (uVar19 != 0) {
    lVar17 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar17);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[uVar21 - uVar19].cached_bytes + lVar17);
      uVar11 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache->cached_bytes + lVar17);
      *puVar3 = *puVar2;
      puVar3[1] = uVar11;
      puVar2 = (undefined8 *)((long)&cache[uVar21 - uVar19].cached_bytes + lVar17);
      *puVar2 = uVar9;
      puVar2[1] = uVar10;
      lVar17 = lVar17 + 0x10;
    } while (uVar19 * 0x10 != lVar17);
  }
  uVar31 = uVar31 - uVar28;
  uVar28 = uVar28 - uVar24;
  uVar24 = uVar31;
  if (uVar28 < uVar31) {
    uVar24 = uVar28;
  }
  if (uVar24 != 0) {
    lVar17 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache[uVar21].cached_bytes + lVar17);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[N - uVar24].cached_bytes + lVar17);
      uVar11 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache[uVar21].cached_bytes + lVar17);
      *puVar3 = *puVar2;
      puVar3[1] = uVar11;
      puVar2 = (undefined8 *)((long)&cache[N - uVar24].cached_bytes + lVar17);
      *puVar2 = uVar9;
      puVar2[1] = uVar10;
      lVar17 = lVar17 + 0x10;
    } while (uVar24 * 0x10 != lVar17);
  }
  N = uVar31 + uVar15;
  multikey_cache<4u,false>(cache,N_00,depth);
  cache = cache + N_00;
  multikey_cache<4u,false>(cache + N,uVar28,depth);
  if ((char)uVar22 == '\0') {
    return;
  }
  depth = depth + 4;
  lVar30 = lVar30 + 4;
  goto LAB_002247c7;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}